

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

QString * __thiscall QStringMatcher::pattern(QString *__return_storage_ptr__,QStringMatcher *this)

{
  if ((this->q_pattern).d.size == 0) {
    QStringView::toString(__return_storage_ptr__,&this->q_sv);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(this->q_pattern).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QStringMatcher::pattern() const
{
    if (!q_pattern.isEmpty())
        return q_pattern;
    return q_sv.toString();
}